

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::
     DefaultPrintTo<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
               (undefined8 param_1,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *param_2,ostream *param_3)

{
  bool bVar1;
  reference value;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  const_iterator end;
  const_iterator it;
  size_t count;
  size_t kMaxCount;
  iu_ostream *os_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *container_local;
  yes_t param_0_local;
  
  it._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::operator<<(param_3,"{");
  end = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::begin(param_2);
  local_40._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(param_2);
  do {
    bVar1 = __gnu_cxx::operator!=(&end,&local_40);
    if (!bVar1) {
LAB_00149031:
      if (it._M_current != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        std::operator<<(param_3," ");
      }
      std::operator<<(param_3,"}");
      return;
    }
    if ((it._M_current != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
       && (std::operator<<(param_3,","),
          it._M_current == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20
          )) {
      std::operator<<(param_3," ...");
      goto LAB_00149031;
    }
    std::operator<<(param_3," ");
    value = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&end);
    UniversalPrint<std::__cxx11::string>(value,param_3);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&end);
    it._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &(it._M_current)->field_0x1;
  } while( true );
}

Assistant:

inline void DefaultPrintTo(IsContainerHelper::yes_t
                        , iutest_type_traits::false_type
                        , const T& container, iu_ostream* os)
{
    const size_t kMaxCount = kValues::MaxPrintContainerCount;
    size_t count = 0;
    *os << "{";
    for( typename T::const_iterator it=container.begin(), end=container.end(); it != end; ++it, ++count)
    {
        if( count > 0 )
        {
            *os << ",";
            if( count == kMaxCount )
            {
                *os << " ...";
                break;
            }
        }
        *os << " ";
        UniversalPrint(*it, os);
    }
    if( count > 0 )
    {
        *os << " ";
    }
    *os << "}";
}